

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppArgs.cpp
# Opt level: O3

bool __thiscall AppArgs::Parse(AppArgs *this,int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  option *poVar5;
  int opt_index;
  char *end;
  int local_3c;
  char *local_38;
  
  poVar5 = this->mLongOptions;
  iVar3 = this->mNumLongOptions;
  poVar5[iVar3].name = (char *)0x0;
  poVar5[iVar3].has_arg = 0;
  poVar5[iVar3].flag = (int *)0x0;
  poVar5[iVar3].val = 0;
  _optind = 0;
  while( true ) {
    iVar3 = getopt_long_only(argc,argv,"",poVar5,&local_3c);
    if (iVar3 != 0) break;
    if ((local_3c < this->mNumLongOptions) && (this->mOptionData[local_3c].numeric == true)) {
      uVar4 = strtol(_optarg,&local_38,0);
      if (*local_38 != '\0') goto LAB_00115040;
      iVar3 = (*this->_vptr_AppArgs[4])(this,(ulong)(uint)this->mKey,uVar4 & 0xffffffff);
      cVar1 = (char)iVar3;
    }
    else {
      iVar3 = (*this->_vptr_AppArgs[3])(this,(ulong)(uint)this->mKey,_optarg);
      cVar1 = (char)iVar3;
    }
    if (cVar1 == '\0') goto LAB_00115040;
    poVar5 = this->mLongOptions;
  }
  if (iVar3 == -1) {
    this->mParamIndex = _optind;
    bVar2 = true;
  }
  else {
LAB_00115040:
    (*this->_vptr_AppArgs[5])(this,*argv);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AppArgs::Parse( int argc, const char *argv[] )
{
	int opt, opt_index;
	char* end;
	const char *optstring;
	
	mLongOptions[ mNumLongOptions ].name = NULL;
	mLongOptions[ mNumLongOptions ].has_arg = 0;
	mLongOptions[ mNumLongOptions ].flag = NULL;
	mLongOptions[ mNumLongOptions ].val = 0;

	optstring = "";
	optind = 0;
	
	do
	{
		opt = getopt_long_only( argc, const_cast<char * const*>( argv ), optstring, mLongOptions, &opt_index );

		switch (opt)
		{
			case 0:
				if ( opt_index < mNumLongOptions && mOptionData[ opt_index ].numeric )
				{
					int val = strtol( optarg, &end, 0 );
					if ( *end != 0 )
					{
						usage( argv[ 0 ] );
						return false;
					}
					if ( handleParam( mKey, val ) == false )
					{
						usage( argv[ 0 ] );
						return false;
					}	
				}
				else
				{
					if ( handleParam( mKey, optarg ) == false )
					{
						usage( argv[ 0 ] );
						return false;
					}
				}
				break;
			
			case -1:
				mParamIndex = optind;
				break;
						
			case ':':
			case '?':
			default:
				usage( argv[ 0 ] );
				return false;				
		}
	} while( opt >= 0 );

	return true;
}